

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inLiteral(Tokenizer *this,char ch)

{
  bool bVar1;
  token_type_e local_24;
  char ch_local;
  Tokenizer *this_local;
  
  bVar1 = isDelimiter(this,ch);
  if (bVar1) {
    this->in_token = false;
    this->char_to_unread = ch;
    this->state = st_token_ready;
    bVar1 = std::operator==(&this->raw_val,"true");
    if ((bVar1) || (bVar1 = std::operator==(&this->raw_val,"false"), bVar1)) {
      local_24 = tt_bool;
    }
    else {
      bVar1 = std::operator==(&this->raw_val,"null");
      local_24 = tt_word;
      if (bVar1) {
        local_24 = tt_null;
      }
    }
    this->type = local_24;
  }
  return;
}

Assistant:

void
Tokenizer::inLiteral(char ch)
{
    if (isDelimiter(ch)) {
        // A C-locale whitespace character or delimiter terminates token.  It is important to unread
        // the whitespace character even though it is ignored since it may be the newline after a
        // stream keyword.  Removing it here could make the stream-reading code break on some files,
        // though not on any files in the test suite as of this writing.

        in_token = false;
        char_to_unread = ch;
        state = st_token_ready;
        type = (raw_val == "true") || (raw_val == "false")
            ? tt::tt_bool
            : (raw_val == "null" ? tt::tt_null : tt::tt_word);
    }
}